

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ctrl_t *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  uintptr_t v;
  slot_type *ppuVar4;
  size_t sVar5;
  ulong uVar6;
  byte bVar7;
  size_t sVar8;
  byte bVar9;
  ctrl_t cVar10;
  ulong uVar11;
  ulong uVar12;
  FindInfo FVar13;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  byte local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>]"
                 );
  }
  sVar5 = common->capacity_;
  if (sVar5 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>]"
                 );
  }
  bVar7 = 0x80;
  if (sVar5 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                *)common);
    if (1 < common->size_) {
      ppuVar4 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                          *)common);
      uVar6 = ((ulong)*ppuVar4 ^ 0x830380) * -0x234dd359734ecb13;
      bVar7 = (byte)(((uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                       (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                       (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                       (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38) ^ (ulong)*ppuVar4) *
                     0x5cb22ca68cb134ed >> 0x38) & 0x7f;
      bVar9 = 1;
      goto LAB_00221f33;
    }
  }
  bVar9 = 0;
LAB_00221f33:
  local_48 = common->capacity_;
  local_40 = (byte)common->size_ & 1;
  local_3f = sVar5 == 1;
  local_58.heap.control = (common->heap_or_soo_).heap.control;
  local_58.heap.slot_array =
       (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
  local_3e = bVar9;
  CommonFields::set_capacity(common,new_capacity);
  bVar3 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,8ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar7,8,8);
  if (local_48 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>]"
                 );
  }
  if ((bVar9 | sVar5 != 1) == 1) {
    ppuVar4 = slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                          *)common);
    uVar2 = local_58.heap.slot_array;
    if (!bVar3) {
      if (sVar5 == 1) {
        uVar6 = ((ulong)local_58.heap.control ^ 0x830380) * -0x234dd359734ecb13;
        uVar11 = ((uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                   (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                   (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28
                  | uVar6 << 0x38) ^ (ulong)local_58.heap.control) * -0x234dd359734ecb13;
        FVar13 = find_first_non_full<void>
                           (common,uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                                   (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8
                                   | (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                                   (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38);
        uVar12 = FVar13.offset;
        uVar6 = common->capacity_;
        if (uVar6 <= uVar12) {
LAB_00222157:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar10 = (ctrl_t)(uVar11 >> 0x38) & ~kEmpty;
        pcVar1 = (common->heap_or_soo_).heap.control;
        pcVar1[uVar12] = cVar10;
        pcVar1[(ulong)((uint)uVar6 & 0xf) + (uVar12 - 0xf & uVar6)] = cVar10;
        common->capacity_ = 0xffffffffffffff9c;
        ppuVar4[uVar12] = (slot_type)local_58.heap.control;
        CommonFields::set_capacity(common,uVar6);
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          sVar8 = 0;
          sVar5 = local_48;
          do {
            if (local_3f == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_58.heap.control[sVar8]) {
              uVar6 = *(ulong *)(uVar2 + sVar8 * 8);
              uVar12 = (uVar6 ^ (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13
              ;
              uVar11 = ((uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                         (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                         (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38) ^ uVar6) * -0x234dd359734ecb13;
              FVar13 = find_first_non_full<void>
                                 (common,uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                                         (uVar11 & 0xff0000000000) >> 0x18 |
                                         (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 |
                                         (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
                                         uVar11 << 0x38);
              uVar12 = FVar13.offset;
              uVar6 = common->capacity_;
              if (uVar6 <= uVar12) goto LAB_00222157;
              cVar10 = (ctrl_t)(uVar11 >> 0x38) & ~kEmpty;
              pcVar1 = (common->heap_or_soo_).heap.control;
              pcVar1[uVar12] = cVar10;
              pcVar1[(ulong)((uint)uVar6 & 0xf) + (uVar12 - 0xf & uVar6)] = cVar10;
              common->capacity_ = 0xffffffffffffff9c;
              ppuVar4[uVar12] = *(slot_type *)(uVar2 + sVar8 * 8);
              CommonFields::set_capacity(common,uVar6);
              sVar5 = local_48;
            }
            sVar8 = sVar8 + 1;
          } while (sVar8 != sVar5);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_5a,8);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }